

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_parse.c
# Opt level: O0

void parse_assignment(LexState *ls,LHSVarList *lh,BCReg nvars)

{
  int iVar1;
  BCReg nexps_00;
  undefined1 local_68 [4];
  BCReg nexps;
  LHSVarList vl;
  ExpDesc e;
  BCReg nvars_local;
  LHSVarList *lh_local;
  LexState *ls_local;
  
  if (((lh->v).k < VLOCAL) || (VINDEXED < (lh->v).k)) {
    err_syntax(ls,LJ_ERR_XSYNTAX);
  }
  iVar1 = lex_opt(ls,0x2c);
  if (iVar1 == 0) {
    lex_check(ls,0x3d);
    nexps_00 = expr_list(ls,(ExpDesc *)&vl.prev);
    if (nexps_00 == nvars) {
      if (e.u.s.info == 0xd) {
        if ((ls->fs->bcbase[(uint)vl.prev].ins & 0xff) == 0x47) {
          ls->fs->freereg = ls->fs->freereg - 1;
        }
        else {
          vl.prev._0_4_ = vl.prev._4_4_;
        }
      }
      bcemit_store(ls->fs,&lh->v,(ExpDesc *)&vl.prev);
      return;
    }
    assign_adjust(ls,nvars,nexps_00,(ExpDesc *)&vl.prev);
  }
  else {
    vl.v._16_8_ = lh;
    expr_primary(ls,(ExpDesc *)local_68);
    if (vl.v.u.s.info == 6) {
      assign_hazard(ls,lh,(ExpDesc *)local_68);
    }
    if (199 < ls->level + nvars) {
      err_limit(ls->fs,200,"variable names");
    }
    parse_assignment(ls,(LHSVarList *)local_68,nvars + 1);
  }
  bcemit_store(ls->fs,&lh->v,(ExpDesc *)&vl.prev);
  return;
}

Assistant:

static void parse_assignment(LexState *ls, LHSVarList *lh, BCReg nvars)
{
  ExpDesc e;
  checkcond(ls, VLOCAL <= lh->v.k && lh->v.k <= VINDEXED, LJ_ERR_XSYNTAX);
  if (lex_opt(ls, ',')) {  /* Collect LHS list and recurse upwards. */
    LHSVarList vl;
    vl.prev = lh;
    expr_primary(ls, &vl.v);
    if (vl.v.k == VLOCAL)
      assign_hazard(ls, lh, &vl.v);
    checklimit(ls->fs, ls->level + nvars, LJ_MAX_XLEVEL, "variable names");
    parse_assignment(ls, &vl, nvars+1);
  } else {  /* Parse RHS. */
    BCReg nexps;
    lex_check(ls, '=');
    nexps = expr_list(ls, &e);
    if (nexps == nvars) {
      if (e.k == VCALL) {
	if (bc_op(*bcptr(ls->fs, &e)) == BC_VARG) {  /* Vararg assignment. */
	  ls->fs->freereg--;
	  e.k = VRELOCABLE;
	} else {  /* Multiple call results. */
	  e.u.s.info = e.u.s.aux;  /* Base of call is not relocatable. */
	  e.k = VNONRELOC;
	}
      }
      bcemit_store(ls->fs, &lh->v, &e);
      return;
    }
    assign_adjust(ls, nvars, nexps, &e);
  }
  /* Assign RHS to LHS and recurse downwards. */
  expr_init(&e, VNONRELOC, ls->fs->freereg-1);
  bcemit_store(ls->fs, &lh->v, &e);
}